

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O1

_Bool duckdb_je_background_threads_disable(tsd_t *tsd)

{
  _Bool _Var1;
  uint uVar2;
  void *pvVar3;
  ulong uVar4;
  
  _Var1 = background_threads_disable_single(tsd,duckdb_je_background_thread_info);
  if ((!_Var1) && (uVar2 = duckdb_je_narenas_total_get(), uVar2 != 0)) {
    uVar4 = 0;
    do {
      pvVar3 = duckdb_je_arenas[uVar4].repr;
      if (pvVar3 == (void *)0x0) {
        pvVar3 = (void *)0x0;
      }
      if (pvVar3 != (void *)0x0) {
        duckdb_je_pa_shard_set_deferral_allowed
                  ((tsdn_t *)tsd,(pa_shard_t *)((long)pvVar3 + 0x29a8),false);
      }
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  return _Var1;
}

Assistant:

bool
background_threads_disable(tsd_t *tsd) {
	assert(!background_thread_enabled());
	malloc_mutex_assert_owner(tsd_tsdn(tsd), &background_thread_lock);

	/* Thread 0 will be responsible for terminating other threads. */
	if (background_threads_disable_single(tsd,
	    &background_thread_info[0])) {
		return true;
	}
	assert(n_background_threads == 0);
	unsigned narenas = narenas_total_get();
	for (unsigned i = 0; i < narenas; i++) {
		arena_t *arena = arena_get(tsd_tsdn(tsd), i, false);
		if (arena != NULL) {
			pa_shard_set_deferral_allowed(tsd_tsdn(tsd),
			    &arena->pa_shard, false);
		}
	}

	return false;
}